

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

iterator __thiscall
cs::tree_type<cs::token_base_*>::merge
          (tree_type<cs::token_base_*> *this,iterator it,tree_type<cs::token_base_*> *tree)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  error *this_00;
  token_base **pptVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *in_RDX;
  tree_node *in_RSI;
  tree_node *root;
  string *in_stack_ffffffffffffff88;
  token_base *ptVar5;
  tree_node *in_stack_ffffffffffffff90;
  allocator local_41;
  string local_40 [16];
  iterator *in_stack_ffffffffffffffd0;
  iterator local_10 [2];
  
  local_10[0].mData = in_RSI;
  bVar2 = iterator::usable(local_10);
  if (!bVar2) {
    this_00 = (error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"E000E",&local_41);
    cov::error::error(this_00,in_stack_ffffffffffffff88);
    __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
  }
  lVar1 = *in_RDX;
  ptVar5 = *(token_base **)(lVar1 + 0x18);
  pptVar4 = iterator::data(in_stack_ffffffffffffffd0);
  *pptVar4 = ptVar5;
  destroy(in_stack_ffffffffffffff90);
  destroy(in_stack_ffffffffffffff90);
  iVar3 = copy(*(EVP_PKEY_CTX **)(lVar1 + 8),(EVP_PKEY_CTX *)local_10[0].mData);
  (local_10[0].mData)->left = (tree_node *)CONCAT44(extraout_var,iVar3);
  iVar3 = copy(*(EVP_PKEY_CTX **)(lVar1 + 0x10),(EVP_PKEY_CTX *)local_10[0].mData);
  (local_10[0].mData)->right = (tree_node *)CONCAT44(extraout_var_00,iVar3);
  return (iterator)local_10[0].mData;
}

Assistant:

iterator merge(iterator it, const tree_type<T> &tree)
		{
			if (!it.usable())
				throw cov::error("E000E");
			tree_node *root = tree.mRoot;
			it.data() = root->data;
			destroy(it.mData->left);
			destroy(it.mData->right);
			it.mData->left = copy(root->left, it.mData);
			it.mData->right = copy(root->right, it.mData);
			return it;
		}